

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::check_collapse_exposure
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  int iVar1;
  LOs *mesh_00;
  Omega_h_Parting OVar2;
  Int IVar3;
  void *extraout_RDX;
  Read<signed_char> RVar4;
  Read<int> local_90;
  Read<signed_char> local_80 [2];
  Read<signed_char> local_60;
  Read<int> local_50;
  Read<signed_char> local_40;
  int local_2c;
  Read<signed_char> *pRStack_28;
  Int cell_dim;
  Read<signed_char> *cand_codes_local;
  LOs *cands2edges_local;
  Mesh *mesh_local;
  
  pRStack_28 = cand_codes;
  cand_codes_local = (Read<signed_char> *)cands2edges;
  cands2edges_local = (LOs *)mesh;
  mesh_local = (Mesh *)this;
  OVar2 = Mesh::parting(mesh);
  if (OVar2 == OMEGA_H_GHOSTED) {
    local_2c = 2;
    while( true ) {
      iVar1 = local_2c;
      IVar3 = Mesh::dim((Mesh *)cands2edges_local);
      mesh_00 = cands2edges_local;
      if (IVar3 < iVar1) break;
      Read<int>::Read(&local_50,cands2edges);
      Read<signed_char>::Read(&local_60,cand_codes);
      check_collapse_exposure((Omega_h *)&local_40,(Mesh *)mesh_00,&local_50,&local_60,local_2c);
      Read<signed_char>::operator=(cand_codes,&local_40);
      Read<signed_char>::~Read(&local_40);
      Read<signed_char>::~Read(&local_60);
      Read<int>::~Read(&local_50);
      local_2c = local_2c + 1;
    }
    Read<signed_char>::Read(local_80,cand_codes);
    Read<int>::Read(&local_90,cands2edges);
    Mesh::sync_subset_array<signed_char>
              ((Mesh *)this,(Int)mesh_00,(Read<signed_char> *)0x1,(LOs *)local_80,(char)&local_90,0)
    ;
    Read<int>::~Read(&local_90);
    Read<signed_char>::~Read(local_80);
    RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar4.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_check_collapse.cpp"
       ,0x6e);
}

Assistant:

Read<I8> check_collapse_exposure(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  for (Int cell_dim = Int(EDGE) + 1; cell_dim <= mesh->dim(); ++cell_dim) {
    cand_codes =
        check_collapse_exposure(mesh, cands2edges, cand_codes, cell_dim);
  }
  return mesh->sync_subset_array(
      EDGE, cand_codes, cands2edges, I8(DONT_COLLAPSE), 1);
}